

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFCommon.cpp
# Opt level: O0

bool glTFCommon::Util::ParseDataURI(char *const_uri,size_t uriLen,DataURI *out)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  size_t j;
  size_t i;
  char *uri;
  DataURI *out_local;
  size_t uriLen_local;
  char *const_uri_local;
  
  if (const_uri == (char *)0x0) {
    const_uri_local._7_1_ = false;
  }
  else if ((*const_uri == '\x10') || (iVar1 = strncmp(const_uri,"data:",5), iVar1 == 0)) {
    out->mediaType = "text/plain";
    out->charset = "US-ASCII";
    out->base64 = false;
    if (*const_uri != '\x10') {
      *const_uri = '\x10';
      const_uri[4] = '\0';
      const_uri[3] = '\0';
      const_uri[2] = '\0';
      const_uri[1] = '\0';
      j = 5;
      if ((const_uri[5] != ';') && (const_uri[5] != ',')) {
        const_uri[1] = '\x05';
        while( true ) {
          bVar3 = false;
          if ((const_uri[j] != ';') && (bVar3 = false, const_uri[j] != ',')) {
            bVar3 = j < uriLen;
          }
          if (!bVar3) break;
          j = j + 1;
        }
      }
      while (const_uri[j] == ';' && j < uriLen) {
        sVar2 = j + 1;
        const_uri[j] = '\0';
        j = sVar2;
        while( true ) {
          bVar3 = false;
          if ((const_uri[j] != ';') && (bVar3 = false, const_uri[j] != ',')) {
            bVar3 = j < uriLen;
          }
          if (!bVar3) break;
          j = j + 1;
        }
        iVar1 = strncmp(const_uri + sVar2,"charset=",8);
        if (iVar1 == 0) {
          const_uri[2] = (char)sVar2 + '\b';
        }
        else {
          iVar1 = strncmp(const_uri + sVar2,"base64",6);
          if (iVar1 == 0) {
            const_uri[3] = (char)sVar2;
          }
        }
      }
      if (j < uriLen) {
        const_uri[j] = '\0';
        const_uri[4] = (char)j + '\x01';
      }
      else {
        const_uri[3] = '\0';
        const_uri[2] = '\0';
        const_uri[1] = '\0';
        const_uri[4] = '\x05';
      }
    }
    if (const_uri[1] != '\0') {
      out->mediaType = const_uri + (int)const_uri[1];
    }
    if (const_uri[2] != '\0') {
      out->charset = const_uri + (int)const_uri[2];
    }
    if (const_uri[3] != '\0') {
      out->base64 = true;
    }
    out->data = const_uri + (int)const_uri[4];
    out->dataLength = (size_t)(const_uri + (uriLen - (long)out->data));
    const_uri_local._7_1_ = true;
  }
  else {
    const_uri_local._7_1_ = false;
  }
  return const_uri_local._7_1_;
}

Assistant:

bool ParseDataURI(const char* const_uri, size_t uriLen, DataURI& out) {
    if (nullptr == const_uri) {
        return false;
    }

    if (const_uri[0] != 0x10) { // we already parsed this uri?
        if (strncmp(const_uri, "data:", 5) != 0) // not a data uri?
            return false;
    }

    // set defaults
    out.mediaType = "text/plain";
    out.charset = "US-ASCII";
    out.base64 = false;

    char* uri = const_cast<char*>(const_uri);
    if (uri[0] != 0x10) {
        uri[0] = 0x10;
        uri[1] = uri[2] = uri[3] = uri[4] = 0;

        size_t i = 5, j;
        if (uri[i] != ';' && uri[i] != ',') { // has media type?
            uri[1] = char(i);
            for (; uri[i] != ';' && uri[i] != ',' && i < uriLen; ++i) {
                // nothing to do!
            }
        }
        while (uri[i] == ';' && i < uriLen) {
            uri[i++] = '\0';
            for (j = i; uri[i] != ';' && uri[i] != ',' && i < uriLen; ++i) {
                // nothing to do!
            }

            if (strncmp(uri + j, "charset=", 8) == 0) {
                uri[2] = char(j + 8);
            }
            else if (strncmp(uri + j, "base64", 6) == 0) {
                uri[3] = char(j);
            }
        }
        if (i < uriLen) {
            uri[i++] = '\0';
            uri[4] = char(i);
        }
        else {
            uri[1] = uri[2] = uri[3] = 0;
            uri[4] = 5;
        }
    }

    if (uri[1] != 0) {
        out.mediaType = uri + uri[1];
    }
    if (uri[2] != 0) {
        out.charset = uri + uri[2];
    }
    if (uri[3] != 0) {
        out.base64 = true;
    }
    out.data = uri + uri[4];
    out.dataLength = (uri + uriLen) - out.data;

    return true;
}